

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

void __thiscall table::addColumn(table *this,vector<column_*,_std::allocator<column_*>_> *cols)

{
  column *pcVar1;
  bool bVar2;
  reference ppcVar3;
  column *col;
  iterator __end1;
  iterator __begin1;
  vector<column_*,_std::allocator<column_*>_> *__range1;
  int element_size;
  int element_true_size;
  vector<column_*,_std::allocator<column_*>_> *cols_local;
  table *this_local;
  
  std::vector<column_*,_std::allocator<column_*>_>::operator=(&this->table_cols,cols);
  __range1._4_4_ = 0;
  __range1._0_4_ = 0;
  __end1 = std::vector<column_*,_std::allocator<column_*>_>::begin(cols);
  col = (column *)std::vector<column_*,_std::allocator<column_*>_>::end(cols);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>
                                *)&col);
    if (!bVar2) break;
    ppcVar3 = __gnu_cxx::
              __normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>::
              operator*(&__end1);
    pcVar1 = *ppcVar3;
    pcVar1->col_offset = __range1._4_4_;
    __range1._4_4_ = pcVar1->element_truesize + __range1._4_4_;
    __range1._0_4_ = pcVar1->element_size + (int)__range1;
    __gnu_cxx::__normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>::
    operator++(&__end1);
  }
  this->recordSize = (int)__range1;
  return;
}

Assistant:

void table::addColumn(vector<column*> &cols){
    table_cols = cols;
    int element_true_size = 0;
    int element_size = 0;
    for(auto col: cols){
        col->col_offset = element_true_size;
        element_true_size += col->element_truesize;
        element_size += col->element_size;
    }
    recordSize = element_size;
}